

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O1

ptrlen BinarySource_get_string(BinarySource *src)

{
  size_t sVar1;
  uint uVar2;
  size_t sVar3;
  ptrlen pVar4;
  
  if (src->err == BSE_NO_ERROR) {
    if (3 < src->len - src->pos) {
      sVar3 = src->pos;
      sVar1 = sVar3 + 4;
      src->pos = sVar1;
      if (src->err != BSE_NO_ERROR) goto LAB_0015fd8d;
      uVar2 = *(uint *)((long)src->data + sVar3);
      pVar4.len._0_4_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if ((ulong)(uint)pVar4.len <= src->len - sVar1) {
        src->pos = (uint)pVar4.len + sVar1;
        pVar4.ptr = (void *)((long)src->data + sVar1);
        pVar4.len._4_4_ = 0;
        return pVar4;
      }
    }
    src->err = BSE_OUT_OF_DATA;
  }
LAB_0015fd8d:
  return (ptrlen)ZEXT816(0x177fb3);
}

Assistant:

ptrlen BinarySource_get_string(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(4))
        return make_ptrlen("", 0);

    ucp = consume(4);
    len = GET_32BIT_MSB_FIRST(ucp);

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}